

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O3

void __thiscall QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint(QProgressDialogPrivate *this)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QSize local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_18 = (QSize)(**(code **)(*(long *)this_00 + 0x70))(this_00);
  pQVar1 = this_00->data;
  if ((pQVar1->widget_attributes & 0x8000) != 0) {
    uVar2 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
    uVar4 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < local_18.wd.m_i.m_i) {
      uVar3 = (ulong)local_18 & 0xffffffff;
    }
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < local_18.ht.m_i.m_i) {
      uVar5 = (ulong)local_18 >> 0x20;
    }
    local_18 = (QSize)(uVar3 | uVar5 << 0x20);
  }
  QWidget::resize(this_00,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint()
{
    Q_Q(QProgressDialog);

    QSize size = q->sizeHint();
    if (q->isVisible())
        size = size.expandedTo(q->size());
    q->resize(size);
}